

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O0

void __thiscall kj::_::Debug::Context::~Context(Context *this)

{
  Context *this_local;
  
  (this->super_ExceptionCallback)._vptr_ExceptionCallback = (_func_int **)&PTR__Context_00c13c18;
  Maybe<kj::_::Debug::Context::Value>::~Maybe(&this->value);
  ExceptionCallback::~ExceptionCallback(&this->super_ExceptionCallback);
  return;
}

Assistant:

Debug::Context::~Context() noexcept(false) {}